

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::DebuggerScope::TryGetValidProperty
          (DebuggerScope *this,PropertyId propertyId,RegSlot location,int offset,
          DebuggerScopeProperty *outScopeProperty,bool *isInDeadZone)

{
  bool bVar1;
  bool *isInDeadZone_local;
  DebuggerScopeProperty *outScopeProperty_local;
  int offset_local;
  RegSlot location_local;
  PropertyId propertyId_local;
  DebuggerScope *this_local;
  
  bVar1 = TryGetProperty(this,propertyId,location,outScopeProperty);
  if ((bVar1) && (bVar1 = IsOffsetInScope(this,offset), bVar1)) {
    if (isInDeadZone != (bool *)0x0) {
      bVar1 = DebuggerScopeProperty::IsInDeadZone(outScopeProperty,offset);
      *isInDeadZone = bVar1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DebuggerScope::TryGetValidProperty(Js::PropertyId propertyId, RegSlot location, int offset, DebuggerScopeProperty* outScopeProperty, bool* isInDeadZone) const
    {
        if (TryGetProperty(propertyId, location, outScopeProperty))
        {
            if (IsOffsetInScope(offset))
            {
                if (isInDeadZone != nullptr)
                {
                    *isInDeadZone = outScopeProperty->IsInDeadZone(offset);
                }

                return true;
            }
        }

        return false;
    }